

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
AttachmentPromiseNode
          (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
           *this,OwnPromiseNode *dependency,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachment)

{
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependency);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00670d90;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::moveFrom
            (&this->attachment,attachment);
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}